

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O3

void glsl_destroy_shader(ALLEGRO_SHADER *shader)

{
  void *in_RDI;
  void *local_20;
  
  local_20 = in_RDI;
  al_lock_mutex(shaders_mutex);
  _al_vector_find_and_delete(&shaders,&local_20);
  al_unlock_mutex(shaders_mutex);
  (*_al_glDeleteShader)(*(GLuint *)((long)in_RDI + 0x50));
  (*_al_glDeleteShader)(*(GLuint *)((long)in_RDI + 0x54));
  (*_al_glDeleteProgram)(*(GLuint *)((long)in_RDI + 0x58));
  al_free_with_context
            (local_20,0x103,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/opengl/ogl_shader.c"
             ,"glsl_destroy_shader");
  return;
}

Assistant:

static void glsl_destroy_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;

   al_lock_mutex(shaders_mutex);
   _al_vector_find_and_delete(&shaders, &shader);
   al_unlock_mutex(shaders_mutex);

   glDeleteShader(gl_shader->vertex_shader);
   glDeleteShader(gl_shader->pixel_shader);
   glDeleteProgram(gl_shader->program_object);
   al_free(shader);
}